

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void keyboardHandleModifiers
               (void *userData,wl_keyboard *keyboard,uint32_t serial,uint32_t modsDepressed,
               uint32_t modsLatched,uint32_t modsLocked,uint32_t group)

{
  int iVar1;
  ulong local_60;
  size_t i;
  anon_struct_8_2_14e37ca0 modifiers [6];
  uint32_t modsLocked_local;
  uint32_t modsLatched_local;
  uint32_t modsDepressed_local;
  uint32_t serial_local;
  wl_keyboard *keyboard_local;
  void *userData_local;
  
  _glfw.wl.serial = serial;
  if (_glfw.wl.xkb.keymap != (xkb_keymap *)0x0) {
    modifiers[5].index = modsLocked;
    modifiers[5].bit = modsLatched;
    (*_glfw.wl.xkb.state_update_mask)
              (_glfw.wl.xkb.state,modsDepressed,modsLatched,modsLocked,0,0,group);
    _glfw.wl.xkb.modifiers = 0;
    modifiers[0].index = _glfw.wl.xkb.altIndex;
    modifiers[0].bit = 4;
    modifiers[1].index = _glfw.wl.xkb.shiftIndex;
    modifiers[1].bit = 1;
    modifiers[2].index = _glfw.wl.xkb.superIndex;
    modifiers[2].bit = 8;
    modifiers[3].index = _glfw.wl.xkb.capsLockIndex;
    modifiers[3].bit = 0x10;
    modifiers[4].index = _glfw.wl.xkb.numLockIndex;
    modifiers[4].bit = 0x20;
    for (local_60 = 0; local_60 < 6; local_60 = local_60 + 1) {
      iVar1 = (*_glfw.wl.xkb.state_mod_index_is_active)
                        (_glfw.wl.xkb.state,modifiers[local_60 - 1].index,XKB_STATE_MODS_EFFECTIVE);
      if (iVar1 == 1) {
        _glfw.wl.xkb.modifiers = modifiers[local_60 - 1].bit | _glfw.wl.xkb.modifiers;
      }
    }
  }
  return;
}

Assistant:

static void keyboardHandleModifiers(void* userData,
                                    struct wl_keyboard* keyboard,
                                    uint32_t serial,
                                    uint32_t modsDepressed,
                                    uint32_t modsLatched,
                                    uint32_t modsLocked,
                                    uint32_t group)
{
    _glfw.wl.serial = serial;

    if (!_glfw.wl.xkb.keymap)
        return;

    xkb_state_update_mask(_glfw.wl.xkb.state,
                          modsDepressed,
                          modsLatched,
                          modsLocked,
                          0,
                          0,
                          group);

    _glfw.wl.xkb.modifiers = 0;

    struct
    {
        xkb_mod_index_t index;
        unsigned int bit;
    } modifiers[] =
    {
        { _glfw.wl.xkb.controlIndex,  GLFW_MOD_CONTROL },
        { _glfw.wl.xkb.altIndex,      GLFW_MOD_ALT },
        { _glfw.wl.xkb.shiftIndex,    GLFW_MOD_SHIFT },
        { _glfw.wl.xkb.superIndex,    GLFW_MOD_SUPER },
        { _glfw.wl.xkb.capsLockIndex, GLFW_MOD_CAPS_LOCK },
        { _glfw.wl.xkb.numLockIndex,  GLFW_MOD_NUM_LOCK }
    };

    for (size_t i = 0; i < sizeof(modifiers) / sizeof(modifiers[0]); i++)
    {
        if (xkb_state_mod_index_is_active(_glfw.wl.xkb.state,
                                          modifiers[i].index,
                                          XKB_STATE_MODS_EFFECTIVE) == 1)
        {
            _glfw.wl.xkb.modifiers |= modifiers[i].bit;
        }
    }
}